

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O1

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateE
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  pointer pdVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  ulong uVar22;
  pointer pdVar23;
  long lVar24;
  long lVar25;
  pointer pdVar26;
  long lVar27;
  pointer pdVar28;
  pointer pdVar29;
  pointer pdVar30;
  long lVar31;
  pointer pdVar32;
  long lVar33;
  pointer pdVar34;
  long lVar35;
  pointer pdVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  int local_d4;
  ulong local_98;
  
  dVar38 = dt * -12.56637061432;
  dVar37 = dt * 29979245800.0;
  dVar40 = dVar37 / (grid->super_Grid<(pica::Dimension)3,_double>).step.x;
  dVar39 = dVar37 / (grid->super_Grid<(pica::Dimension)3,_double>).step.y;
  dVar37 = dVar37 / (grid->super_Grid<(pica::Dimension)3,_double>).step.z;
  uVar5 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.x;
  uVar6 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
  iVar1 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.z;
  lVar14 = (long)iVar1;
  uVar13 = iVar1 - 1;
  uVar16 = uVar5 - 1;
  uVar8 = (ulong)(uVar6 - 1);
  uVar9 = (ulong)uVar13;
  if (0 < (int)uVar16) {
    uVar7 = 0;
    local_d4 = 1;
    do {
      if (1 < (int)uVar6) {
        iVar2 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y;
        lVar10 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
        iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y;
        lVar33 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
        pdVar11 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar35 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
        pdVar26 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar17 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
        lVar24 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
        pdVar28 = (pointer)((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y
                                       * uVar7) * lVar24 * 8 +
                           (long)(grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        lVar31 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.z;
        lVar25 = (long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y * uVar7);
        pdVar18 = pdVar26 + (lVar25 + 1) * lVar35;
        pdVar20 = (pointer)((long)(iVar3 * local_d4) * lVar33 * 8 + (long)pdVar11);
        pdVar26 = (pointer)(lVar25 * lVar35 * 8 + (long)pdVar26);
        pdVar11 = (pointer)((long)(int)(iVar3 * uVar7) * lVar33 * 8 + (long)pdVar11);
        lVar25 = (long)(int)(iVar2 * uVar7);
        pdVar34 = (pointer)((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.y
                                       * uVar7) * lVar31 * 8 +
                           (long)(grid->super_Grid<(pica::Dimension)3,_double>).jzData.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        pdVar29 = (pointer)((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y
                                       * uVar7) * lVar17 * 8 +
                           (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar32 = (pointer)((long)(iVar2 * local_d4) * lVar10 * 8 + (long)pdVar19);
        lVar27 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.z;
        pdVar21 = (pointer)((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.y
                                       * uVar7) * lVar27 * 8 +
                           (long)(grid->super_Grid<(pica::Dimension)3,_double>).jyData.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        pdVar23 = (pointer)(lVar10 * 8 * lVar25 + (long)pdVar19);
        pdVar19 = pdVar19 + (lVar25 + 1) * lVar10;
        pdVar36 = (pointer)((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y
                                       * uVar7) * lVar14 * 8 +
                           (long)(grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        lVar25 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.z;
        pdVar30 = (pointer)((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.y
                                       * uVar7) * lVar25 * 8 +
                           (long)(grid->super_Grid<(pica::Dimension)3,_double>).jxData.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        local_98 = 0;
        do {
          if (1 < iVar1) {
            lVar15 = 0;
            do {
              *(double *)((long)pdVar36 + lVar15) =
                   (*(double *)((long)pdVar11 + lVar15 + 8) - *(double *)((long)pdVar11 + lVar15)) *
                   -dVar37 + *(double *)((long)pdVar30 + lVar15) * dVar38 +
                             (*(double *)((long)pdVar19 + lVar15) -
                             *(double *)((long)pdVar23 + lVar15)) * dVar39 +
                   *(double *)((long)pdVar36 + lVar15);
              *(double *)((long)pdVar29 + lVar15) =
                   (*(double *)((long)pdVar32 + lVar15) - *(double *)((long)pdVar23 + lVar15)) *
                   -dVar40 + *(double *)((long)pdVar21 + lVar15) * dVar38 +
                             (*(double *)((long)pdVar26 + lVar15 + 8) -
                             *(double *)((long)pdVar26 + lVar15)) * dVar37 +
                   *(double *)((long)pdVar29 + lVar15);
              *(double *)((long)pdVar28 + lVar15) =
                   (*(double *)((long)pdVar18 + lVar15) - *(double *)((long)pdVar26 + lVar15)) *
                   -dVar39 + *(double *)((long)pdVar34 + lVar15) * dVar38 +
                             (*(double *)((long)pdVar20 + lVar15) -
                             *(double *)((long)pdVar11 + lVar15)) * dVar40 +
                   *(double *)((long)pdVar28 + lVar15);
              lVar15 = lVar15 + 8;
            } while (uVar9 * 8 != lVar15);
          }
          local_98 = local_98 + 1;
          pdVar28 = pdVar28 + lVar24;
          pdVar18 = pdVar18 + lVar35;
          pdVar20 = pdVar20 + lVar33;
          pdVar34 = pdVar34 + lVar31;
          pdVar29 = pdVar29 + lVar17;
          pdVar32 = pdVar32 + lVar10;
          pdVar26 = pdVar26 + lVar35;
          pdVar21 = pdVar21 + lVar27;
          pdVar36 = pdVar36 + lVar14;
          pdVar11 = pdVar11 + lVar33;
          pdVar23 = pdVar23 + lVar10;
          pdVar19 = pdVar19 + lVar10;
          pdVar30 = pdVar30 + lVar25;
        } while (local_98 != uVar8);
      }
      uVar7 = uVar7 + 1;
      local_d4 = local_d4 + 1;
    } while (uVar7 != uVar16);
  }
  if (0 < (int)uVar16) {
    iVar2 = (grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.y;
    lVar10 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.z;
    pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).jzData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    lVar17 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
    pdVar20 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    lVar27 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
    pdVar11 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar26 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y;
    lVar31 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
    lVar24 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y * lVar17;
    lVar25 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y * lVar27;
    pdVar18 = pdVar26 + lVar27;
    uVar12 = 0;
    pdVar21 = pdVar20;
    do {
      pdVar21 = pdVar21 + lVar24;
      pdVar23 = pdVar19;
      pdVar28 = pdVar11;
      pdVar29 = pdVar21;
      uVar22 = uVar8;
      pdVar30 = pdVar20;
      pdVar32 = pdVar18;
      pdVar34 = pdVar26;
      if (1 < (int)uVar6) {
        do {
          pdVar28[(int)uVar13] =
               (pdVar32[(int)uVar13] - pdVar34[(int)uVar13]) * -dVar39 +
               pdVar23[(int)uVar13] * dVar38 +
               (pdVar29[(int)uVar13] - pdVar30[(int)uVar13]) * dVar40 + pdVar28[(int)uVar13];
          pdVar23 = pdVar23 + lVar10;
          pdVar29 = pdVar29 + lVar17;
          pdVar30 = pdVar30 + lVar17;
          pdVar34 = pdVar34 + lVar27;
          pdVar28 = pdVar28 + lVar31;
          pdVar32 = pdVar32 + lVar27;
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
      }
      uVar12 = uVar12 + 1;
      pdVar19 = pdVar19 + iVar2 * lVar10;
      pdVar20 = pdVar20 + lVar24;
      pdVar26 = pdVar26 + lVar25;
      pdVar11 = pdVar11 + iVar3 * lVar31;
      pdVar18 = pdVar18 + lVar25;
    } while (uVar12 != uVar16);
  }
  if (0 < (int)uVar16) {
    iVar2 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.y;
    lVar10 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.z;
    iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y;
    lVar33 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
    lVar31 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y;
    lVar27 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
    pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar4 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y;
    lVar25 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
    lVar17 = (long)(int)(uVar6 - 1);
    pdVar20 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar25 * lVar17;
    lVar24 = lVar31 * lVar27;
    pdVar18 = pdVar19 + lVar27 * lVar17;
    pdVar19 = pdVar19 + (lVar31 + lVar17) * lVar27;
    pdVar26 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar33 * lVar17 + 1;
    pdVar11 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar17 * lVar10;
    uVar12 = 0;
    do {
      if (1 < iVar1) {
        lVar17 = 0;
        do {
          *(double *)((long)pdVar20 + lVar17) =
               (*(double *)((long)pdVar19 + lVar17) - *(double *)((long)pdVar18 + lVar17)) * -dVar40
               + *(double *)((long)pdVar11 + lVar17) * dVar38 +
                 (*(double *)((long)pdVar26 + lVar17) - *(double *)((long)pdVar26 + lVar17 + -8)) *
                 dVar37 + *(double *)((long)pdVar20 + lVar17);
          lVar17 = lVar17 + 8;
        } while (uVar9 * 8 - lVar17 != 0);
      }
      uVar12 = uVar12 + 1;
      pdVar20 = pdVar20 + iVar4 * lVar25;
      pdVar18 = pdVar18 + lVar24;
      pdVar19 = pdVar19 + lVar24;
      pdVar26 = pdVar26 + iVar3 * lVar33;
      pdVar11 = pdVar11 + iVar2 * lVar10;
    } while (uVar12 != uVar16);
  }
  if (1 < (int)uVar6) {
    lVar10 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.z;
    lVar25 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
    pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    lVar17 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
    lVar24 = (long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y * uVar16);
    pdVar20 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start +
              (int)(uVar16 * (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y) * lVar14;
    pdVar26 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start +
              (int)((grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y * uVar16) * lVar17
              + 1;
    pdVar18 = pdVar19 + lVar25 * lVar24;
    pdVar11 = (grid->super_Grid<(pica::Dimension)3,_double>).jxData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start +
              (int)((grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.y * uVar16) * lVar10;
    pdVar19 = pdVar19 + (lVar24 + 1) * lVar25;
    uVar12 = 0;
    do {
      if (1 < iVar1) {
        lVar24 = 0;
        do {
          *(double *)((long)pdVar20 + lVar24) =
               (*(double *)((long)pdVar26 + lVar24) - *(double *)((long)pdVar26 + lVar24 + -8)) *
               -dVar37 + *(double *)((long)pdVar11 + lVar24) * dVar38 +
                         (*(double *)((long)pdVar19 + lVar24) - *(double *)((long)pdVar18 + lVar24))
                         * dVar39 + *(double *)((long)pdVar20 + lVar24);
          lVar24 = lVar24 + 8;
        } while (uVar9 << 3 != lVar24);
      }
      uVar12 = uVar12 + 1;
      pdVar20 = pdVar20 + lVar14;
      pdVar26 = pdVar26 + lVar17;
      pdVar18 = pdVar18 + lVar25;
      pdVar19 = pdVar19 + lVar25;
      pdVar11 = pdVar11 + lVar10;
    } while (uVar12 != uVar8);
  }
  return;
}

Assistant:

static void updateE(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        const ValueType coeffCurrent = -static_cast<ValueType>(4) * Constants<ValueType>::pi() * dt;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(0, 0, 0);
        const IndexType end = grid.getSize() - IndexType(1, 1, 1);
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.ex(i, j, k) += coeffCurrent * grid.jx(i, j, k) +
                coeff.y * (grid.bz(i, j + 1, k) - grid.bz(i, j, k)) -
                coeff.z * (grid.by(i, j, k + 1) - grid.by(i, j, k));
            grid.ey(i, j, k) += coeffCurrent * grid.jy(i, j, k) +
                coeff.z * (grid.bx(i, j, k + 1) - grid.bx(i, j, k)) -
                coeff.x * (grid.bz(i + 1, j, k) - grid.bz(i, j, k));
            grid.ez(i, j, k) += coeffCurrent * grid.jz(i, j, k) +
                coeff.x * (grid.by(i + 1, j, k) - grid.by(i, j, k)) -
                coeff.y * (grid.bx(i, j + 1, k) - grid.bx(i, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.ez(i, j, end.z) += coeffCurrent * grid.jz(i, j, end.z) +
                coeff.x * (grid.by(i + 1, j, end.z) - grid.by(i, j, end.z)) -
                coeff.y * (grid.bx(i, j + 1, end.z) - grid.bx(i, j, end.z));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.ey(i, end.y, k) += coeffCurrent * grid.jy(i, end.y, k) +
                coeff.z * (grid.bx(i, end.y, k + 1) - grid.bx(i, end.y, k)) -
                coeff.x * (grid.bz(i + 1, end.y, k) - grid.bz(i, end.y, k));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.ex(end.x, j, k) += coeffCurrent * grid.jx(end.x, j, k) +
                coeff.y * (grid.bz(end.x, j + 1, k) - grid.bz(end.x, j, k)) -
                coeff.z * (grid.by(end.x, j, k + 1) - grid.by(end.x, j, k));
    }